

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# component.cpp
# Opt level: O1

void __thiscall
Component_definedComponentImport_Test::~Component_definedComponentImport_Test
          (Component_definedComponentImport_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Component, definedComponentImport)
{
    libcellml::ComponentPtr c = libcellml::Component::create("a_component");
    libcellml::ComponentPtr importComponent = libcellml::Component::create("import_component");
    libcellml::VariablePtr v = libcellml::Variable::create("a_variable");
    libcellml::UnitsPtr u = libcellml::Units::create("only_standard_units");

    libcellml::ImportSourcePtr importSource = libcellml::ImportSource::create();
    importSource->setUrl("I_am_a_url");

    importComponent->setImportSource(importSource);
    importComponent->setImportReference("ref");

    importComponent->addVariable(v);
    v->setUnits(u);

    c->addComponent(importComponent);

    EXPECT_FALSE(c->isDefined());
}